

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2cf95::ArenaTest_ReallocFastPath_Test::~ArenaTest_ReallocFastPath_Test
          (ArenaTest_ReallocFastPath_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaTest, ReallocFastPath) {
  upb_Arena* arena = upb_Arena_Init(nullptr, 4096, &upb_alloc_global);
  void* initial = upb_Arena_Malloc(arena, 512);
  uintptr_t initial_allocated = upb_Arena_SpaceAllocated(arena, nullptr);
  void* extend = upb_Arena_Realloc(arena, initial, 512, 1024);
  uintptr_t extend_allocated = upb_Arena_SpaceAllocated(arena, nullptr);
  EXPECT_EQ(initial, extend);
  EXPECT_EQ(initial_allocated, extend_allocated);
  upb_Arena_Free(arena);
}